

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::keyPressEvent(QMessageBox *this,QKeyEvent *e)

{
  bool bVar1;
  QFlagsStorage<Qt::KeyboardModifier> QVar2;
  uint uVar3;
  enum_type eVar4;
  QMessageBoxPrivate *pQVar5;
  ulong uVar6;
  EVP_PKEY_CTX *src;
  QKeyEvent *in_RSI;
  EVP_PKEY_CTX *dst;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *pb;
  QList<QAbstractButton_*> *__range3;
  int key;
  QMessageBoxPrivate *d;
  QKeySequence shortcut;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QAbstractButton_*> buttons;
  KeyboardModifier in_stack_ffffffffffffff5c;
  enum_type in_stack_ffffffffffffff60;
  enum_type in_stack_ffffffffffffff64;
  QKeyEvent *in_stack_ffffffffffffff80;
  enum_type in_stack_ffffffffffffff88;
  enum_type eVar7;
  QKeyCombination local_54;
  undefined1 *local_50;
  QAbstractButton **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  undefined4 local_10;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QMessageBox *)0x7a63f5);
  uVar6 = QKeyEvent::matches((StandardKey)in_RSI);
  if ((uVar6 & 1) == 0) {
    dst = (EVP_PKEY_CTX *)0x9;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    if (bVar1) {
      if (((pQVar5->detailsText != (QMessageBoxDetailsText *)0x0) &&
          (bVar1 = QWidget::isVisible((QWidget *)0x7a6469), bVar1)) &&
         (uVar3 = QMessageBoxDetailsText::copy(pQVar5->detailsText,dst,src), (uVar3 & 1) != 0)) {
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,1);
        goto LAB_007a672b;
      }
    }
    else {
      bVar1 = ::operator==((QKeyEvent *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
      if (((bVar1) && (pQVar5->detailsText != (QMessageBoxDetailsText *)0x0)) &&
         (bVar1 = QWidget::isVisible((QWidget *)0x7a64d2), bVar1)) {
        QMessageBoxDetailsText::selectAll((QMessageBoxDetailsText *)0x7a64e9);
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,1);
        goto LAB_007a672b;
      }
    }
    local_10 = QKeyEvent::modifiers();
    local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         Qt::operator|(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    QVar2.i = (Int)QFlags<Qt::KeyboardModifier>::operator|
                             ((QFlags<Qt::KeyboardModifier> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c);
    local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(in_RDI,0));
    bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
    if (bVar1) {
      in_stack_ffffffffffffff88 = QKeyEvent::key(in_RSI);
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & ~KeyboardModifierMask;
      if (in_stack_ffffffffffffff88 != NoModifier) {
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        QDialogButtonBox::buttons((QDialogButtonBox *)in_RDI);
        in_stack_ffffffffffffff80 = (QKeyEvent *)&local_30;
        local_38.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = QList<QAbstractButton_*>::begin
                             ((QList<QAbstractButton_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_40.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = QList<QAbstractButton_*>::end
                             ((QList<QAbstractButton_*> *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        while( true ) {
          local_48 = local_40.i;
          bVar1 = QList<QAbstractButton_*>::const_iterator::operator!=(&local_38,local_40);
          if (!bVar1) break;
          QList<QAbstractButton_*>::const_iterator::operator*(&local_38);
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractButton::shortcut(in_RDI);
          uVar3 = QKeySequence::isEmpty();
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 & 0xffffff;
          if ((uVar3 & 1) == 0) {
            eVar7 = in_stack_ffffffffffffff88;
            local_54.combination = QKeySequence::operator[]((uint)&local_50);
            eVar4 = QKeyCombination::key(&local_54);
            in_stack_ffffffffffffff64 =
                 CONCAT13(in_stack_ffffffffffffff88 == eVar4,(int3)in_stack_ffffffffffffff64);
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff88;
            in_stack_ffffffffffffff88 = eVar7;
          }
          bVar1 = (char)(in_stack_ffffffffffffff64 >> 0x18) != '\0';
          if (bVar1) {
            QAbstractButton::animateClick
                      ((QAbstractButton *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          }
          QKeySequence::~QKeySequence((QKeySequence *)&local_50);
          if (bVar1) goto LAB_007a6702;
          QList<QAbstractButton_*>::const_iterator::operator++(&local_38);
        }
        bVar1 = false;
LAB_007a6702:
        QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a670c);
        if (bVar1) goto LAB_007a672b;
      }
    }
    QDialog::keyPressEvent
              ((QDialog *)CONCAT44(QVar2.i,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80);
  }
  else if (pQVar5->detectedEscapeButton != (QAbstractButton *)0x0) {
    QAbstractButton::click(in_RDI);
  }
LAB_007a672b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::keyPressEvent(QKeyEvent *e)
{
#if QT_CONFIG(shortcut)
        Q_D(QMessageBox);
        if (e->matches(QKeySequence::Cancel)) {
            if (d->detectedEscapeButton) {
#ifdef Q_OS_MAC
                d->detectedEscapeButton->animateClick();
#else
                d->detectedEscapeButton->click();
#endif
            }
            return;
        }
#endif // QT_CONFIG(shortcut)

#if !defined(QT_NO_CLIPBOARD) && !defined(QT_NO_SHORTCUT)

#if QT_CONFIG(textedit)
        if (e == QKeySequence::Copy) {
            if (d->detailsText && d->detailsText->isVisible() && d->detailsText->copy()) {
                e->setAccepted(true);
                return;
            }
        } else if (e == QKeySequence::SelectAll && d->detailsText && d->detailsText->isVisible()) {
            d->detailsText->selectAll();
            e->setAccepted(true);
            return;
        }
#endif // QT_CONFIG(textedit)

#if defined(Q_OS_WIN)
        if (e == QKeySequence::Copy) {
            const auto separator = "---------------------------\n"_L1;
            QString textToCopy;
            textToCopy += separator + windowTitle() + u'\n' + separator // title
                          + d->label->text() + u'\n' + separator;       // text

            if (d->informativeLabel)
                textToCopy += d->informativeLabel->text() + u'\n' + separator;

            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (const auto *button : buttons)
                textToCopy += button->text() + "   "_L1;
            textToCopy += u'\n' + separator;
#if QT_CONFIG(textedit)
            if (d->detailsText)
                textToCopy += d->detailsText->text() + u'\n' + separator;
#endif
            QGuiApplication::clipboard()->setText(textToCopy);
            return;
        }
#endif // Q_OS_WIN

#endif // !QT_NO_CLIPBOARD && !QT_NO_SHORTCUT

#ifndef QT_NO_SHORTCUT
    if (!(e->modifiers() & (Qt::AltModifier | Qt::ControlModifier | Qt::MetaModifier))) {
        int key = e->key() & ~Qt::MODIFIER_MASK;
        if (key) {
            const QList<QAbstractButton *> buttons = d->buttonBox->buttons();
            for (auto *pb : buttons) {
                QKeySequence shortcut = pb->shortcut();
                if (!shortcut.isEmpty() && key == shortcut[0].key()) {
                    pb->animateClick();
                    return;
                }
            }
        }
    }
#endif
    QDialog::keyPressEvent(e);
}